

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnImportGlobal
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  Stream *this_00;
  uint uVar1;
  Enum EVar2;
  undefined8 uVar3;
  char *pcVar4;
  string local_68;
  byte local_45;
  uint local_44;
  bool mutable__local;
  BinaryReaderLogging *pBStack_40;
  Index import_index_local;
  BinaryReaderLogging *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderLogging *)field_name._M_len;
  field_name_local._M_str = (char *)module_name._M_len;
  local_45 = mutable_;
  local_44 = import_index;
  pBStack_40 = this;
  WriteIndent(this);
  uVar1 = local_44;
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_68,&type);
  uVar3 = std::__cxx11::string::c_str();
  pcVar4 = "false";
  if ((local_45 & 1) != 0) {
    pcVar4 = "true";
  }
  Stream::Writef(this_00,
                 "OnImportGlobal(import_index: %u, global_index: %u, type: %s, mutable: %s)\n",
                 (ulong)uVar1,(ulong)global_index,uVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_68);
  EVar2 = (*this->reader_->_vptr_BinaryReaderDelegate[0x15])
                    (this->reader_,(ulong)local_44,field_name_local._M_str,module_name._M_str,
                     this_local,field_name_local._M_len,global_index,type,(uint)(local_45 & 1));
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderLogging::OnImportGlobal(Index import_index,
                                           std::string_view module_name,
                                           std::string_view field_name,
                                           Index global_index,
                                           Type type,
                                           bool mutable_) {
  LOGF("OnImportGlobal(import_index: %" PRIindex ", global_index: %" PRIindex
       ", type: %s, mutable: "
       "%s)\n",
       import_index, global_index, type.GetName().c_str(),
       mutable_ ? "true" : "false");
  return reader_->OnImportGlobal(import_index, module_name, field_name,
                                 global_index, type, mutable_);
}